

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O3

int luv_cwd(lua_State *L)

{
  int iVar1;
  size_t size;
  char path [8192];
  size_t local_2010;
  char local_2008 [8192];
  
  local_2010 = 0x2000;
  iVar1 = uv_cwd(local_2008,&local_2010);
  if (iVar1 < 0) {
    luv_error(L,iVar1);
    iVar1 = 3;
  }
  else {
    lua_pushlstring(L,local_2008,local_2010);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int luv_cwd(lua_State* L) {
  size_t size = 2*PATH_MAX;
  char path[2*PATH_MAX];
  int ret = uv_cwd(path, &size);
  if (ret < 0) return luv_error(L, ret);
  lua_pushlstring(L, path, size);
  return 1;
}